

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

bool __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::erase
          (iterator *this,allocator_type *alloc,bool shouldRecomputeBounds)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIVar4;
  pointer pEVar5;
  size_type sVar6;
  FreeNode *pFVar7;
  undefined8 uVar8;
  FreeNode *pFVar9;
  uint32_t uVar10;
  uintptr_t intWord;
  ulong uVar11;
  uint uVar12;
  
  pIVar4 = (this->super_const_iterator).map;
  pEVar5 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar6 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar12 = pEVar5[sVar6 - 1].offset;
  uVar10 = pIVar4->height;
  if (uVar10 == 0) {
    uVar10 = pIVar4->rootSize;
    if (uVar10 != uVar12 + 1) {
      do {
        uVar11 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        puVar1 = (undefined8 *)((long)&pIVar4->field_0 + (ulong)uVar12 * 0x10);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pIVar4->field_0 + uVar11 * 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
      } while (uVar10 - 1 != uVar12);
    }
    uVar10 = pIVar4->rootSize - 1;
    pIVar4->rootSize = uVar10;
    ((this->super_const_iterator).path.path.
     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size = uVar10;
  }
  else {
    pFVar7 = (FreeNode *)pEVar5[sVar6 - 1].node;
    uVar3 = pEVar5[sVar6 - 1].size;
    if (uVar3 == 1) {
      pFVar7->next = alloc->freeList;
      alloc->freeList = pFVar7;
      eraseNode(this,uVar10,alloc);
      return true;
    }
    if (uVar3 != uVar12 + 1) {
      do {
        uVar11 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        pFVar9 = (pFVar7 + (ulong)uVar12 * 2)[1].next;
        pFVar7[uVar11 * 2].next = pFVar7[(ulong)uVar12 * 2].next;
        (pFVar7 + uVar11 * 2)[1].next = pFVar9;
      } while (uVar3 - 1 != uVar12);
    }
    uVar12 = pIVar4->height;
    pEVar5 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar10 = pEVar5[(this->super_const_iterator).path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size;
    pEVar5[uVar12].size = uVar10 - 1;
    if ((ulong)uVar12 != 0) {
      *(ulong *)((long)pEVar5[uVar12 - 1].node + (ulong)pEVar5[uVar12 - 1].offset * 8) =
           *(ulong *)((long)pEVar5[uVar12 - 1].node + (ulong)pEVar5[uVar12 - 1].offset * 8) &
           0xffffffffffffffc0 | (ulong)(uVar10 - 2);
    }
    if (shouldRecomputeBounds) {
      recomputeBounds(this,uVar12);
    }
  }
  return false;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::erase(allocator_type& alloc,
                                                   bool shouldRecomputeBounds) {
    auto& map = *this->map;
    auto& path = this->path;
    SLANG_ASSERT(this->valid());

    uint32_t offset = path.leafOffset();
    if (this->isFlat()) {
        map.rootLeaf.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        return false;
    }

    // Nodes are not allowed to become empty, so erase the node itself
    // if that were to be the case.
    auto& node = path.template leaf<Leaf>();
    if (path.leafSize() == 1) {
        alloc.destroy(&node);
        eraseNode(map.height, alloc);
        return true;
    }

    // Otherwise just erase the current entry.
    node.erase(offset, offset + 1, path.leafSize());
    path.setSize(map.height, path.leafSize() - 1);

    if (shouldRecomputeBounds)
        recomputeBounds(map.height);

    return false;
}